

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_id.c
# Opt level: O0

FUNCTION_RETURN getAdapterInfos(OsAdapterInfo *adapterInfos,size_t *adapter_info_size)

{
  sa_family_t sVar1;
  undefined4 uVar2;
  sockaddr *psVar3;
  int iVar4;
  char *ifnames_00;
  int local_74;
  int i;
  sockaddr_ll *s1_1;
  in_addr_t iaddr;
  sockaddr_in *s1;
  char *ifnames;
  uint local_48;
  uint if_max;
  uint if_num;
  int if_name_position;
  int n;
  int family;
  ifaddrs *ifa;
  ifaddrs *ifaddr;
  size_t *psStack_20;
  FUNCTION_RETURN f_return;
  size_t *adapter_info_size_local;
  OsAdapterInfo *adapterInfos_local;
  
  ifaddr._4_4_ = FUNC_RET_OK;
  psStack_20 = adapter_info_size;
  adapter_info_size_local = (size_t *)adapterInfos;
  iVar4 = getifaddrs(&ifa);
  if (iVar4 == -1) {
    perror("getifaddrs");
    adapterInfos_local._4_4_ = FUNC_RET_ERROR;
  }
  else {
    if (adapter_info_size_local != (size_t *)0x0) {
      memset(adapter_info_size_local,0,*psStack_20 * 0x414);
    }
    ifnames._4_4_ = 0;
    for (_n = ifa; _n != (ifaddrs *)0x0; _n = _n->ifa_next) {
      if (_n->ifa_addr != (sockaddr *)0x0) {
        ifnames._4_4_ = ifnames._4_4_ + 1;
      }
    }
    ifnames_00 = (char *)malloc((ulong)(uint)(ifnames._4_4_ * 0x401));
    memset(ifnames_00,0,(ulong)(uint)(ifnames._4_4_ * 0x401));
    local_48 = 0;
    for (_n = ifa; _n != (ifaddrs *)0x0; _n = _n->ifa_next) {
      if (_n->ifa_addr != (sockaddr *)0x0) {
        if_max = ifname_position(ifnames_00,_n->ifa_name,local_48);
        if ((int)if_max < 0) {
          strncpy(ifnames_00 + local_48 * 0x401,_n->ifa_name,0x401);
          if ((adapter_info_size_local != (size_t *)0x0) && ((ulong)local_48 < *psStack_20)) {
            strncpy((char *)((long)adapter_info_size_local + (ulong)local_48 * 0x414 + 4),
                    _n->ifa_name,0x400);
          }
          if_max = local_48;
          local_48 = local_48 + 1;
          if (adapter_info_size_local == (size_t *)0x0) goto LAB_002881db;
        }
        sVar1 = _n->ifa_addr->sa_family;
        if (sVar1 == 2) {
          if ((adapter_info_size_local != (size_t *)0x0) && ((ulong)(long)(int)if_max < *psStack_20)
             ) {
            uVar2 = *(undefined4 *)(_n->ifa_addr->sa_data + 2);
            *(char *)((long)adapter_info_size_local + (long)(int)if_max * 0x414 + 0x40c) =
                 (char)uVar2;
            *(char *)((long)adapter_info_size_local + (long)(int)if_max * 0x414 + 0x40d) =
                 (char)((uint)uVar2 >> 8);
            *(char *)((long)adapter_info_size_local + (long)(int)if_max * 0x414 + 0x40e) =
                 (char)((uint)uVar2 >> 0x10);
            *(char *)((long)adapter_info_size_local + (long)(int)if_max * 0x414 + 0x40f) =
                 (char)((uint)uVar2 >> 0x18);
          }
        }
        else if ((((sVar1 == 0x11) && (_n->ifa_data != (void *)0x0)) &&
                 (psVar3 = _n->ifa_addr, adapter_info_size_local != (size_t *)0x0)) &&
                ((ulong)(long)(int)if_max < *psStack_20)) {
          for (local_74 = 0; local_74 < 6; local_74 = local_74 + 1) {
            *(char *)((long)adapter_info_size_local +
                     (long)local_74 + (long)(int)if_max * 0x414 + 0x404) =
                 psVar3->sa_data[(long)local_74 + 10];
          }
        }
      }
LAB_002881db:
    }
    *psStack_20 = (ulong)local_48;
    if (adapter_info_size_local == (size_t *)0x0) {
      ifaddr._4_4_ = FUNC_RET_OK;
    }
    else if (*psStack_20 < (ulong)local_48) {
      ifaddr._4_4_ = FUNC_RET_BUFFER_TOO_SMALL;
    }
    freeifaddrs(ifa);
    free(ifnames_00);
    adapterInfos_local._4_4_ = ifaddr._4_4_;
  }
  return adapterInfos_local._4_4_;
}

Assistant:

FUNCTION_RETURN getAdapterInfos(OsAdapterInfo * adapterInfos,
		size_t * adapter_info_size) {

	FUNCTION_RETURN f_return = FUNC_RET_OK;
	struct ifaddrs *ifaddr, *ifa;
	int family, n = 0, if_name_position;
	unsigned int if_num, if_max;
	//char host[NI_MAXHOST];
	char *ifnames;

	if (getifaddrs(&ifaddr) == -1) {
		perror("getifaddrs");
		return FUNC_RET_ERROR;
	}

	if (adapterInfos != NULL) {
		memset(adapterInfos, 0, (*adapter_info_size) * sizeof(OsAdapterInfo));
	}

	/* count the maximum number of interfaces */
	for (ifa = ifaddr, if_max = 0; ifa != NULL; ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL) {
			continue;
		}
		if_max++;
	}

	/* allocate space for names */
	ifnames = (char*) malloc(NI_MAXHOST * if_max);
	memset(ifnames, 0, NI_MAXHOST * if_max);
	/* Walk through linked list, maintaining head pointer so we
	 can free list later */
	for (ifa = ifaddr, n = 0, if_num = 0; ifa != NULL;
			ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL) {
			continue;
		}
		if_name_position = ifname_position(ifnames, ifa->ifa_name, if_num);
		//interface name not seen en advance
		if (if_name_position < 0) {
			strncpy(&ifnames[if_num * NI_MAXHOST], ifa->ifa_name, NI_MAXHOST);
			if (adapterInfos != NULL && if_num < *adapter_info_size) {
				strncpy(adapterInfos[if_num].description, ifa->ifa_name,
				NI_MAXHOST-1);
			}
			if_name_position = if_num;
			if_num++;
			if (adapterInfos == NULL) {
				continue;
			}
		}
		family = ifa->ifa_addr->sa_family;
		/* Display interface name and family (including symbolic
		 form of the latter for the common families) */
#ifdef _DEBUG
		printf("%-8s %s (%d)\n", ifa->ifa_name,
				(family == AF_PACKET) ? "AF_PACKET" :
				(family == AF_INET) ? "AF_INET" :
				(family == AF_INET6) ? "AF_INET6" : "???", family);
#endif
		/* For an AF_INET* interface address, display the address
		 * || family == AF_INET6*/
		if (family == AF_INET) {
			/*
			 s = getnameinfo(ifa->ifa_addr,
			 (family == AF_INET) ?
			 sizeof(struct sockaddr_in) :
			 sizeof(struct sockaddr_in6), host, NI_MAXHOST,
			 NULL, 0, NI_NUMERICHOST);

			 #ifdef _DEBUG
			 s = getnameinfo(ifa->ifa_addr, sizeof(struct sockaddr_in), host,
			 NI_MAXHOST,
			 NULL, 0, NI_NUMERICHOST);
			 if (s != 0) {
			 printf("getnameinfo() failed: %s\n", gai_strerror(s));
			 }
			 printf("\t\taddress: <%s>\n", host);
			 #endif
			 */
			if (adapterInfos != NULL && if_name_position < *adapter_info_size) {
				struct sockaddr_in *s1 = (struct sockaddr_in*) ifa->ifa_addr;
				in_addr_t iaddr = s1->sin_addr.s_addr;
				adapterInfos[if_name_position].ipv4_address[0] = (iaddr
						& 0x000000ff);
				adapterInfos[if_name_position].ipv4_address[1] = (iaddr
						& 0x0000ff00) >> 8;
				adapterInfos[if_name_position].ipv4_address[2] = (iaddr
						& 0x00ff0000) >> 16;
				adapterInfos[if_name_position].ipv4_address[3] = (iaddr
						& 0xff000000) >> 24;
			}
		} else if (family == AF_PACKET && ifa->ifa_data != NULL) {
			struct sockaddr_ll *s1 = (struct sockaddr_ll*) ifa->ifa_addr;
			if (adapterInfos != NULL && if_name_position < *adapter_info_size) {
				for (int i = 0; i < 6; i++) {
					adapterInfos[if_name_position].mac_address[i] =
							s1->sll_addr[i];
#ifdef _DEBUG
					printf("%02x:", s1->sll_addr[i]);
#endif
				}
#ifdef _DEBUG
				printf("\t %s\n", ifa->ifa_name);
#endif

			}
		}
	}

	*adapter_info_size = if_num;
	if (adapterInfos == NULL) {
		f_return = FUNC_RET_OK;
	} else if (*adapter_info_size < if_num) {
		f_return = FUNC_RET_BUFFER_TOO_SMALL;
	}
	freeifaddrs(ifaddr);
	free(ifnames);
	return f_return;
}